

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_59333a::LoopReportController::collective_flush
          (LoopReportController *this,OutputStream *stream,Comm *comm)

{
  Options *this_00;
  Comm *this_01;
  CalQLParser *this_02;
  SnapshotProcessFn *push;
  pointer *ppAVar1;
  undefined8 uVar2;
  LoopReportController *this_03;
  bool bVar3;
  int iVar4;
  StreamType SVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  anon_union_8_7_33918203_for_value aVar9;
  ostream *poVar10;
  anon_union_8_7_33918203_for_value __dest;
  char *pcVar11;
  anon_union_8_7_33918203_for_value *paVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pLVar15;
  uint uVar16;
  uint __len;
  pointer val;
  CaliperMetadataDB db;
  size_type __dnew_1;
  Aggregator cross_agg;
  Aggregator summary_cross_agg;
  CalQLParser parser;
  string name;
  Aggregator summary_local_agg;
  Aggregator local_agg;
  string query_1;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  string query;
  Caliper c;
  QuerySpec summary_query_spec;
  undefined1 local_748 [24];
  pointer local_730;
  code *local_728 [2];
  Comm local_718;
  undefined1 local_710 [32];
  Aggregator local_6f0;
  FormatProcessor local_6e0;
  LoopReportController *local_6d0;
  undefined1 local_6c8 [32];
  undefined1 local_6a8 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_680;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_678;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  *local_670;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> *local_668;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> *local_660;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_658;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_650;
  _Base_ptr local_648;
  _Rb_tree_node_base *local_640;
  pointer local_638;
  pointer local_630;
  pointer local_628;
  undefined1 local_620 [32];
  anon_union_8_7_33918203_for_value local_600;
  vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> local_5f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a8;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> local_580;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> local_558 [3];
  undefined1 local_510 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b0;
  _Rb_tree_node_base local_480 [4];
  int local_400;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  local_3f8;
  anon_union_8_7_33918203_for_value local_3e0;
  anon_union_8_7_33918203_for_value local_3d8;
  anon_union_8_7_33918203_for_value local_3d0 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  SortSpec SStack_360;
  Node NStack_338;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_2f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_290;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  vStack_260;
  _Any_data local_248;
  _Manager_type local_238;
  _Any_data local_228;
  code *local_218;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  Caliper local_1e8;
  QuerySpec local_1c8;
  
  cali::Caliper::Caliper(&local_1e8);
  cali::CaliperMetadataDB::CaliperMetadataDB((CaliperMetadataDB *)local_748);
  local_600.unmanaged_ptr =
       &local_5f8.
        super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8.aggregate._0_8_ =
       (__uniq_ptr_data<cali::CalQLParser::CalQLParserImpl,_std::default_delete<cali::CalQLParser::CalQLParserImpl>,_true,_true>
        )0xd3;
  aVar9.v_uint = std::__cxx11::string::_M_create(&local_600.v_uint,(ulong)&local_1c8);
  uVar2 = local_1c8.aggregate._0_8_;
  local_5f8.
  super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8.aggregate._0_8_;
  local_600.v_uint = aVar9.v_uint;
  memcpy(aVar9.unmanaged_ptr,
         " let iter_per_sec=ratio(loop.iterations,time.duration.ns,1e-9) select loop,count(),sum(loop.iterations),scale(time.duration.ns,1e-9),min(iter_per_sec),max(iter_per_sec),avg(iter_per_sec) group by loop where loop"
         ,0xd3);
  local_5f8.
  super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar2;
  *(undefined1 *)(uVar2 + (long)aVar9.unmanaged_ptr) = 0;
  this_00 = &this->m_opts;
  cali::ConfigManager::Options::build_query
            ((string *)&local_3e0,this_00,"local",(string *)&local_600);
  if (local_600 !=
      &local_5f8.
       super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(local_600.unmanaged_ptr,
                    (ulong)((long)&(((QuerySpec *)
                                    &(local_5f8.
                                      super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->op)->aggregate).
                                   selection + 1));
  }
  cali::CalQLParser::CalQLParser((CalQLParser *)&local_1c8,(char *)local_3e0.unmanaged_ptr);
  cali::CalQLParser::spec((QuerySpec *)&local_600,(CalQLParser *)&local_1c8);
  local_aggregate((LoopReportController *)local_620,(Caliper *)this,(CaliperMetadataDB *)&local_1e8,
                  (QuerySpec *)local_748);
  std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
  ~vector((vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
           *)local_480);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_510);
  std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
            (local_558);
  std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
            (&local_580);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d0);
  std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
  ~vector(&local_5f8);
  cali::CalQLParser::~CalQLParser((CalQLParser *)&local_1c8);
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
  }
  local_3e0.unmanaged_ptr = local_3d0;
  local_748._16_8_ = (pointer)0x12b;
  local_6d0 = this;
  aVar9.v_uint = std::__cxx11::string::_M_create(&local_3e0.v_uint,(ulong)(local_748 + 0x10));
  uVar2 = local_748._16_8_;
  local_3d0[0].v_uint = local_748._16_8_;
  local_3e0.v_uint = aVar9.v_uint;
  memcpy(aVar9.unmanaged_ptr,
         " select loop as Loop,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",min(min#iter_per_sec) as \"Iter/s (min)\",max(max#iter_per_sec) as \"Iter/s (max)\",ratio(sum#loop.iterations,scale#time.duration.ns) as \"Iter/s (avg)\" aggregate max(count) group by loop format table"
         ,299);
  local_3d8.v_uint = uVar2;
  *(undefined1 *)((long)&((FunctionSignature *)uVar2)->id + (long)aVar9.unmanaged_ptr) = 0;
  cali::ConfigManager::Options::build_query
            ((string *)&local_600,this_00,"cross",(string *)&local_3e0);
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
  }
  cali::CalQLParser::CalQLParser((CalQLParser *)&local_3e0,(char *)local_600.unmanaged_ptr);
  cali::CalQLParser::spec(&local_1c8,(CalQLParser *)&local_3e0);
  cali::CalQLParser::~CalQLParser((CalQLParser *)&local_3e0);
  if (local_600 !=
      &local_5f8.
       super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(local_600.unmanaged_ptr,
                    (ulong)((long)&(local_5f8.
                                    super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
  }
  cali::Aggregator::Aggregator(&local_6f0,&local_1c8);
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)local_228._M_pod_data,&local_6f0);
  cali::Aggregator::flush
            ((Aggregator *)local_620,(CaliperMetadataAccessInterface *)local_748,
             (SnapshotProcessFn *)&local_228);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  (*comm->_vptr_Comm[5])(comm,local_748,&local_6f0);
  iVar4 = (*comm->_vptr_Comm[2])(comm);
  if (iVar4 == 0) {
    SVar5 = cali::OutputStream::type(stream);
    if (SVar5 == None) {
      cali::ConfigManager::Options::get_abi_cxx11_((string *)&local_600,this_00,"output","stdout");
      cali::Caliper::Caliper((Caliper *)&local_3e0);
      cali::OutputStream::OutputStream((OutputStream *)local_710);
      aVar9 = local_600;
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)(local_748 + 0x10),
                 (Caliper *)&local_3e0);
      cali::OutputStream::set_filename
                ((OutputStream *)local_710,(char *)aVar9.unmanaged_ptr,
                 (CaliperMetadataAccessInterface *)&local_3e0,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)(local_748 + 0x10));
      if ((pointer)local_748._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_748._16_8_,(long)local_728[0] - local_748._16_8_);
      }
      if (local_600 !=
          &local_5f8.
           super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete(local_600.unmanaged_ptr,
                        (ulong)((long)&(local_5f8.
                                        super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
      }
      (stream->mP).
      super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_710._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(stream->mP).
                  super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_710 + 8));
      cali::OutputStream::~OutputStream((OutputStream *)local_710);
    }
    poVar10 = cali::OutputStream::stream(stream);
    bVar3 = cali::ConfigManager::Options::is_set(this_00,"summary");
    if (bVar3) {
      cali::ConfigManager::Options::get_abi_cxx11_((string *)&local_3e0,this_00,"summary","");
      local_600.unmanaged_ptr =
           &local_5f8.
            super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_600,local_3e0.v_uint,
                 (long)local_3d8.unmanaged_ptr + (long)local_3e0.unmanaged_ptr);
      bVar3 = cali::StringConverter::to_bool((StringConverter *)&local_600,(bool *)0x0);
      if (local_600 !=
          &local_5f8.
           super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete(local_600.unmanaged_ptr,
                        (ulong)((long)&(local_5f8.
                                        super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
      }
      if (local_3e0 != local_3d0) {
        operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
      }
      if (!bVar3) goto LAB_0020fc93;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\nLoop summary:\n------------\n\n",0x1d);
    cali::FormatProcessor::FormatProcessor((FormatProcessor *)&local_600,&local_1c8,stream);
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::FormatProcessor&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)&local_248,(FormatProcessor *)&local_600);
    cali::Aggregator::flush
              (&local_6f0,(CaliperMetadataAccessInterface *)local_748,
               (SnapshotProcessFn *)&local_248);
    if (local_238 != (_Manager_type)0x0) {
      (*local_238)(&local_248,&local_248,__destroy_functor);
    }
    cali::FormatProcessor::flush
              ((FormatProcessor *)&local_600,(CaliperMetadataAccessInterface *)local_748);
    cali::FormatProcessor::~FormatProcessor((FormatProcessor *)&local_600);
  }
LAB_0020fc93:
  bVar3 = cali::ConfigManager::Options::is_set(this_00,"timeseries");
  if (bVar3) {
    cali::ConfigManager::Options::get_abi_cxx11_((string *)&local_3e0,this_00,"timeseries","");
    local_600.unmanaged_ptr =
         &local_5f8.
          super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_600,local_3e0.v_uint,
               (long)local_3d8.unmanaged_ptr + (long)local_3e0.unmanaged_ptr);
    bVar3 = cali::StringConverter::to_bool((StringConverter *)&local_600,(bool *)0x0);
    if (local_600 !=
        &local_5f8.
         super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete(local_600.unmanaged_ptr,
                      (ulong)((long)&(local_5f8.
                                      super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
    }
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
    }
    if (!bVar3) goto LAB_002107da;
  }
  local_208._M_unused._M_object = &local_3f8;
  local_3f8.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._8_8_ = 0;
  pcStack_1f0 = std::
                _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/LoopReportController.cpp:243:41)>
                ::_M_invoke;
  local_1f8 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/LoopReportController.cpp:243:41)>
              ::_M_manager;
  cali::Aggregator::flush
            (&local_6f0,(CaliperMetadataAccessInterface *)local_748,(SnapshotProcessFn *)&local_208)
  ;
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  if (local_3f8.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_3f8.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar12 = &local_600;
    std::ofstream::ofstream(paVar12);
    local_400 = 1;
    iVar4 = cali::Log::verbosity();
    this_03 = local_6d0;
    if (local_400 <= iVar4) {
      paVar12 = (anon_union_8_7_33918203_for_value *)cali::Log::get_stream((Log *)&local_600);
    }
    cali::ChannelController::name_abi_cxx11_((string *)&local_3e0,(ChannelController *)this_03);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&paVar12->v_bool,(char *)local_3e0.unmanaged_ptr,local_3d8.v_int
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": No instrumented loops found",0x1d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
    }
    local_600.v_uint = (uint64_t)_VTT;
    *(undefined8 *)(&local_600.v_bool + _VTT[-1].attribute._M_string_length) =
         ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_5f8);
    std::ios_base::~ios_base((ios_base *)(local_510 + 8));
  }
  else {
    local_640 = local_480;
    local_648 = (_Base_ptr)&local_4b0;
    local_650 = &local_4e0;
    local_658 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_510;
    local_660 = local_558;
    local_668 = &local_580;
    local_6a8._8_8_ = _VTT;
    local_6a8._0_8_ = ___throw_bad_array_new_length;
    local_670 = &vStack_260;
    local_678 = &_Stack_290;
    local_680 = &_Stack_2c0;
    local_6a8._32_8_ = &_Stack_2f0;
    local_6a8._24_8_ = &NStack_338;
    local_6a8._16_8_ = &SStack_360;
    local_630 = (pointer)&PTR__Comm_0027ba28;
    local_638 = local_3f8.
                super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pLVar15 = local_3f8.
              super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    val = local_3f8.
          super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (0 < val->iterations) {
        local_718._vptr_Comm = (_func_int **)local_630;
        this_01 = (Comm *)(local_728 + 2);
        iVar4 = cali::internal::CustomOutputController::Comm::bcast_int(this_01,val->iterations);
        iVar6 = cali::internal::CustomOutputController::Comm::bcast_int(this_01,val->count);
        cali::internal::CustomOutputController::Comm::bcast_str
                  ((string *)local_6c8,this_01,&val->name);
        if (0 < iVar4) {
          local_628 = val;
          bVar3 = cali::ConfigManager::Options::is_set(this_00,"timeseries.maxrows");
          iVar7 = 0x14;
          if (bVar3) {
            cali::ConfigManager::Options::get_abi_cxx11_
                      ((string *)&local_3e0,this_00,"timeseries.maxrows","");
            local_600.unmanaged_ptr =
                 &local_5f8.
                  super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_600,local_3e0.v_uint,
                       (long)local_3d8.unmanaged_ptr + (long)local_3e0.unmanaged_ptr);
            iVar7 = cali::StringConverter::to_int((StringConverter *)&local_600,(bool *)0x0);
            if (local_600 !=
                &local_5f8.
                 super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete(local_600.unmanaged_ptr,
                              (ulong)((long)&(local_5f8.
                                              super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
            }
            if (local_3e0 != local_3d0) {
              operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
            }
          }
          if (iVar7 < 1) {
            iVar7 = iVar6;
          }
          uVar16 = 1;
          if (iVar7 < iVar6) {
            uVar16 = iVar4 / iVar7;
          }
          uVar14 = 1;
          if (1 < (int)uVar16) {
            uVar14 = (ulong)uVar16;
          }
          local_3e0.unmanaged_ptr = local_3d0;
          local_600.v_uint = 0x7a;
          __dest.v_uint = std::__cxx11::string::_M_create(&local_3e0.v_uint,(ulong)&local_600);
          aVar9 = local_600;
          local_3d0[0].v_uint = local_600.v_uint;
          local_3e0.v_uint = __dest.v_uint;
          memcpy(__dest.unmanaged_ptr,
                 " select Block,scale(time.duration.ns,1e-9),sum(loop.iterations),ratio(loop.iterations,time.duration.ns,1e9) group by Block"
                 ,0x7a);
          local_3d8.v_uint = aVar9.v_uint;
          *(undefined1 *)(__dest.v_uint + aVar9.v_uint) = 0;
          pcVar11 = (char *)std::__cxx11::string::append((char *)&local_3e0.v_int);
          pLVar15 = local_638;
          __len = 1;
          ppAVar1 = &local_5f8.
                     super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (9 < (int)uVar16) {
            uVar13 = uVar14;
            uVar16 = 4;
            do {
              __len = uVar16;
              uVar8 = (uint)uVar13;
              if (uVar8 < 100) {
                __len = __len - 2;
                goto LAB_002100f0;
              }
              if (uVar8 < 1000) {
                __len = __len - 1;
                goto LAB_002100f0;
              }
              if (uVar8 < 10000) goto LAB_002100f0;
              uVar13 = uVar13 / 10000;
              uVar16 = __len + 4;
            } while (99999 < uVar8);
            __len = __len + 1;
          }
LAB_002100f0:
          local_600 = (anon_union_8_7_33918203_for_value)ppAVar1;
          std::__cxx11::string::_M_construct((ulong)&local_600,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_600.unmanaged_ptr,__len,(uint)uVar14);
          pcVar11 = (char *)std::__cxx11::string::_M_append(pcVar11,local_600.v_uint);
          std::__cxx11::string::append(pcVar11);
          if (local_600 != ppAVar1) {
            operator_delete(local_600.unmanaged_ptr,
                            (ulong)((long)&(local_5f8.
                                            super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
          }
          pcVar11 = (char *)std::__cxx11::string::append((char *)&local_3e0.v_int);
          pcVar11 = (char *)std::__cxx11::string::_M_append(pcVar11,local_6c8._0_8_);
          std::__cxx11::string::append(pcVar11);
          cali::ConfigManager::Options::build_query
                    ((string *)&local_600,this_00,"local",(string *)&local_3e0);
          val = local_628;
          std::__cxx11::string::operator=((string *)&local_3e0.v_bool,(string *)&local_600.v_bool);
          ppAVar1 = &local_5f8.
                     super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          this_02 = (CalQLParser *)(local_748 + 0x10);
          if (local_600 != ppAVar1) {
            operator_delete(local_600.unmanaged_ptr,
                            (ulong)((long)&(local_5f8.
                                            super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
          }
          cali::CalQLParser::CalQLParser(this_02,(char *)local_3e0.unmanaged_ptr);
          cali::CalQLParser::spec((QuerySpec *)&local_600,this_02);
          local_aggregate((LoopReportController *)(local_620 + 0x10),(Caliper *)local_6d0,
                          (CaliperMetadataDB *)&local_1e8,(QuerySpec *)local_748);
          std::
          vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
          ::~vector((vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                     *)local_640);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_648);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_650);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_658);
          std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::
          ~vector(local_660);
          std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
          ~vector(local_668);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5d0);
          std::
          vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
          ~vector(&local_5f8);
          cali::CalQLParser::~CalQLParser(this_02);
          if (local_3e0 != local_3d0) {
            operator_delete(local_3e0.unmanaged_ptr,local_3d0[0].v_uint + 1);
          }
          local_710._0_8_ = (element_type *)0xc4;
          local_600 = (anon_union_8_7_33918203_for_value)ppAVar1;
          aVar9.v_uint = std::__cxx11::string::_M_create(&local_600.v_uint,(ulong)local_710);
          uVar2 = local_710._0_8_;
          local_5f8.
          super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_710._0_8_;
          local_600.v_uint = aVar9.v_uint;
          memcpy(aVar9.unmanaged_ptr,
                 " select Block,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" group by Block format table order by Block "
                 ,0xc4);
          local_5f8.
          super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar2;
          *(char *)(uVar2 + (long)aVar9.unmanaged_ptr) = '\0';
          cali::ConfigManager::Options::build_query
                    ((string *)(local_748 + 0x10),this_00,"cross",(string *)&local_600);
          if (local_600 !=
              &local_5f8.
               super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
            operator_delete(local_600.unmanaged_ptr,
                            (ulong)((long)&(local_5f8.
                                            super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->op + 1));
          }
          cali::CalQLParser::CalQLParser((CalQLParser *)&local_6e0,(char *)local_748._16_8_);
          bVar3 = cali::CalQLParser::error((CalQLParser *)&local_6e0);
          push = (SnapshotProcessFn *)(local_748 + 0x10);
          if (bVar3) {
            std::ofstream::ofstream(&local_600);
            local_400 = 0;
            iVar4 = cali::Log::verbosity();
            paVar12 = &local_600;
            if (local_400 <= iVar4) {
              paVar12 = (anon_union_8_7_33918203_for_value *)
                        cali::Log::get_stream((Log *)&local_600);
            }
            cali::CalQLParser::error_msg_abi_cxx11_((string *)local_710,(CalQLParser *)&local_6e0);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&paVar12->v_bool,(char *)local_710._0_8_,local_710._8_8_
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_748._16_8_,(long)local_730);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((element_type *)local_710._0_8_ != (element_type *)(local_710 + 0x10)) {
              operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
            }
            local_600.v_uint = local_6a8._8_8_;
            *(undefined8 *)
             (&local_600.v_bool + (((pointer)(local_6a8._8_8_ + -0x28))->attribute)._M_string_length
             ) = local_6a8._0_8_;
            std::filebuf::~filebuf((filebuf *)&local_5f8);
            std::ios_base::~ios_base((ios_base *)(local_510 + 8));
          }
          cali::CalQLParser::CalQLParser((CalQLParser *)&local_600,(char *)local_748._16_8_);
          cali::CalQLParser::spec((QuerySpec *)&local_3e0,(CalQLParser *)&local_600);
          cali::CalQLParser::~CalQLParser((CalQLParser *)&local_600);
          cali::CalQLParser::~CalQLParser((CalQLParser *)&local_6e0);
          if ((pointer)local_748._16_8_ != (pointer)local_728) {
            operator_delete((void *)local_748._16_8_,(ulong)(local_728[0] + 1));
          }
          cali::Aggregator::Aggregator((Aggregator *)local_710,(QuerySpec *)&local_3e0);
          std::
          function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
          ::function<cali::Aggregator&,void>
                    ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                      *)&local_600.v_bool,(Aggregator *)local_710);
          cali::Aggregator::flush
                    ((Aggregator *)(local_620 + 0x10),(CaliperMetadataAccessInterface *)local_748,
                     (SnapshotProcessFn *)&local_600);
          if ((element_type *)
              local_5f8.
              super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
              ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
            (*(code *)local_5f8.
                      super__Vector_base<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                      ._M_impl.super__Vector_impl_data._M_finish)(&local_600,&local_600,3);
          }
          cali::internal::CustomOutputController::Comm::cross_aggregate
                    ((Comm *)(local_728 + 2),(CaliperMetadataDB *)local_748,(Aggregator *)local_710)
          ;
          iVar4 = cali::internal::CustomOutputController::Comm::rank((Comm *)(local_728 + 2));
          if (iVar4 == 0) {
            poVar10 = cali::OutputStream::stream(stream);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nIteration summary (",0x14)
            ;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(val->name)._M_dataplus._M_p,(val->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"):\n-----------------\n\n",0x16);
            cali::FormatProcessor::FormatProcessor(&local_6e0,(QuerySpec *)&local_3e0,stream);
            std::
            function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
            ::function<cali::FormatProcessor&,void>
                      ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                        *)push,&local_6e0);
            cali::Aggregator::flush
                      ((Aggregator *)local_710,(CaliperMetadataAccessInterface *)local_748,push);
            if (local_728[0] != (code *)0x0) {
              (*local_728[0])(push,push,3);
            }
            cali::FormatProcessor::flush(&local_6e0,(CaliperMetadataAccessInterface *)local_748);
            cali::FormatProcessor::~FormatProcessor(&local_6e0);
          }
          cali::Aggregator::~Aggregator((Aggregator *)local_710);
          std::
          vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
          ::~vector(local_670);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_678);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_680);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_6a8._32_8_);
          std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::
          ~vector((vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> *)
                  local_6a8._24_8_);
          std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
          ~vector((vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> *
                  )local_6a8._16_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_388);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_3b0);
          std::
          vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
          ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                   *)&local_3d8);
          cali::Aggregator::~Aggregator((Aggregator *)(local_620 + 0x10));
        }
        if ((pointer)local_6c8._0_8_ != (pointer)(local_6c8 + 0x10)) {
          operator_delete((void *)local_6c8._0_8_,(ulong)(local_6c8._16_8_ + 1));
        }
        cali::internal::CustomOutputController::Comm::~Comm((Comm *)(local_728 + 2));
      }
      val = val + 1;
    } while (val != pLVar15);
  }
  std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
  ~vector(&local_3f8);
LAB_002107da:
  cali::Aggregator::~Aggregator(&local_6f0);
  std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
  ~vector(&local_1c8.preprocess_ops);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.units._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.aliases._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&local_1c8 + 0xf0));
  std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
            ((vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> *)
             ((long)&local_1c8 + 0xa8));
  std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
            ((vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> *)
             ((long)&local_1c8 + 0x80));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&local_1c8 + 0x58));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&local_1c8 + 0x30));
  std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
  ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> *
          )((long)&local_1c8 + 8));
  cali::Aggregator::~Aggregator((Aggregator *)local_620);
  cali::CaliperMetadataDB::~CaliperMetadataDB((CaliperMetadataDB *)local_748);
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        Caliper           c;
        CaliperMetadataDB db;

        Aggregator summary_local_agg  = summary_local_aggregation(c, db);
        QuerySpec  summary_query_spec = summary_query();
        Aggregator summary_cross_agg(summary_query_spec);

        summary_local_agg.flush(db, summary_cross_agg);

        comm.cross_aggregate(db, summary_cross_agg);

        if (comm.rank() == 0) {
            if (stream.type() == OutputStream::None)
                stream = create_stream();

            std::ostream* os = stream.stream();

            bool print_summary = true;
            if (m_opts.is_set("summary"))
                print_summary = StringConverter(m_opts.get("summary")).to_bool();

            if (print_summary) {
                *os << "\nLoop summary:\n------------\n\n";

                FormatProcessor formatter(summary_query_spec, stream);
                summary_cross_agg.flush(db, formatter);
                formatter.flush(db);
            }
        }

        bool print_timeseries = true;
        if (m_opts.is_set("timeseries"))
            print_timeseries = StringConverter(m_opts.get("timeseries")).to_bool();

        if (print_timeseries) {
            std::vector<LoopInfo> infovec;

            summary_cross_agg.flush(db, [&infovec](CaliperMetadataAccessInterface& db, const EntryList& rec) {
                infovec.push_back(get_loop_info(db, rec));
            });

            if (!infovec.empty()) {
                for (const LoopInfo& loopinfo : infovec)
                    if (loopinfo.iterations > 0)
                        process_timeseries(c, db, stream, loopinfo, comm);
            } else {
                Log(1).stream() << name() << ": No instrumented loops found" << std::endl;
            }
        }
    }